

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O0

undefined8 duckdb::HoursFun::GetFunctions(void)

{
  undefined8 in_RDI;
  LogicalType *in_stack_000000c8;
  LogicalType local_20 [32];
  
  duckdb::LogicalType::LogicalType(local_20,BIGINT);
  GetTimePartFunction<duckdb::DatePart::HoursOperator,long>(in_stack_000000c8);
  duckdb::LogicalType::~LogicalType(local_20);
  return in_RDI;
}

Assistant:

ScalarFunctionSet HoursFun::GetFunctions() {
	return GetTimePartFunction<DatePart::HoursOperator>();
}